

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O2

void __thiscall
rcg::GenTLException::GenTLException
          (GenTLException *this,string *msg,shared_ptr<const_rcg::GenTLWrapper> *gentl)

{
  ostream *poVar1;
  ostringstream *this_00;
  GC_ERROR err;
  size_t tmp_size;
  ostringstream out;
  char tmp [1024];
  int local_5cc;
  size_t local_5c8;
  string local_5c0 [32];
  ostringstream local_5a0 [376];
  char local_428 [1024];
  
  *(undefined ***)this = &PTR__GenTLException_00127c50;
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  (this->s)._M_string_length = 0;
  (this->s).field_2._M_local_buf[0] = '\0';
  memset(local_428,0,0x400);
  local_5c8 = 0x400;
  (*((gentl->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    GCGetLastError)(&local_5cc,local_428,&local_5c8);
  this_00 = local_5a0;
  std::__cxx11::ostringstream::ostringstream(this_00);
  if ((msg->_M_string_length == 0) || (local_5cc == 0)) {
    if (msg->_M_string_length != 0) {
      std::operator<<((ostream *)local_5a0,(string *)msg);
      goto LAB_0011a6ba;
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)local_5a0,(string *)msg);
    this_00 = (ostringstream *)std::operator<<(poVar1,": ");
  }
  poVar1 = std::operator<<((ostream *)this_00,local_428);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_5cc);
  std::operator<<(poVar1,")");
LAB_0011a6ba:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->s,local_5c0);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  return;
}

Assistant:

GenTLException::GenTLException(const std::string &msg,
                               const std::shared_ptr<const GenTLWrapper> &gentl)
{
  GenTL::GC_ERROR err;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);

  gentl->GCGetLastError(&err, tmp, &tmp_size);

  std::ostringstream out;

  if (msg.size() > 0 && err != GenTL::GC_ERR_SUCCESS)
  {
    out << msg << ": " << tmp << " (" << err << ")";
  }
  else if (msg.size() > 0)
  {
    out << msg;
  }
  else
  {
    out << tmp << " (" << err << ")";
  }

  s=out.str();
}